

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DXFLoader.cpp
# Opt level: O1

void __thiscall
Assimp::DXFImporter::ParsePolyLineVertex(DXFImporter *this,LineReader *reader,PolyLine *line)

{
  pointer *ppuVar1;
  pointer *ppaVar2;
  pointer *ppaVar3;
  size_t __n;
  iterator __position;
  iterator __position_00;
  pointer puVar4;
  iterator __position_01;
  int iVar5;
  byte *pbVar6;
  Logger *pLVar7;
  uint uVar8;
  ulong in_RCX;
  char cVar9;
  char cVar10;
  char *pcVar11;
  ulong uVar12;
  bool bVar13;
  uint cnti;
  aiVector3D out;
  aiColor4D clr;
  uint indices [4];
  float local_6c;
  uint local_68;
  aiVector3t<float> local_64;
  aiColor4D local_58;
  int aiStack_48 [6];
  
  cVar10 = '\0';
  local_68 = 0;
  local_64.x = 0.0;
  local_64.y = 0.0;
  local_64.z = 0.0;
  local_58 = AI_DXF_DEFAULT_COLOR;
  bVar13 = true;
  if (reader->end < 2) {
    do {
      iVar5 = reader->groupcode;
      if (iVar5 < 0x3e) {
        bVar13 = SUB81(in_RCX,0);
        if (iVar5 < 0x14) {
          if (iVar5 == 8) {
            __n = (reader->value)._M_string_length;
            if ((__n != (line->layer)._M_string_length) ||
               ((__n != 0 &&
                (iVar5 = bcmp((reader->value)._M_dataplus._M_p,(line->layer)._M_dataplus._M_p,__n),
                iVar5 != 0)))) {
              pLVar7 = DefaultLogger::get();
              pcVar11 = 
              "DXF: expected vertex to be part of a poly-face but the 0x128 flag isn\'t set";
              goto LAB_00425510;
            }
          }
          else if (iVar5 == 10) {
            local_6c = 0.0;
            fast_atoreal_move<float>
                      ((Assimp *)(reader->value)._M_dataplus._M_p,(char *)&local_6c,(float *)0x1,
                       bVar13);
            local_64.x = local_6c;
          }
          else if (iVar5 == 0) break;
        }
        else if (iVar5 == 0x14) {
          local_6c = 0.0;
          fast_atoreal_move<float>
                    ((Assimp *)(reader->value)._M_dataplus._M_p,(char *)&local_6c,(float *)0x1,
                     bVar13);
          local_64.y = local_6c;
        }
        else if (iVar5 == 0x1e) {
          local_6c = 0.0;
          fast_atoreal_move<float>
                    ((Assimp *)(reader->value)._M_dataplus._M_p,(char *)&local_6c,(float *)0x1,
                     bVar13);
          local_64.z = local_6c;
        }
      }
      else {
        in_RCX = (ulong)(iVar5 - 0x47U);
        if (iVar5 - 0x47U < 4) {
          uVar12 = (ulong)local_68;
          if (uVar12 == 4) {
            pLVar7 = DefaultLogger::get();
            pcVar11 = "DXF: more than 4 indices per face not supported; ignoring";
LAB_00425510:
            Logger::warn(pLVar7,pcVar11);
          }
          else {
            pcVar11 = (reader->value)._M_dataplus._M_p;
            cVar9 = *pcVar11;
            iVar5 = 0;
            if (0xf5 < (byte)(cVar9 - 0x3aU)) {
              iVar5 = 0;
              do {
                pcVar11 = pcVar11 + 1;
                iVar5 = (uint)(byte)(cVar9 - 0x30) + iVar5 * 10;
                cVar9 = *pcVar11;
              } while (0xf5 < (byte)(cVar9 - 0x3aU));
            }
            local_68 = local_68 + 1;
            in_RCX = (ulong)local_68;
            aiStack_48[uVar12] = iVar5;
          }
        }
        else if (iVar5 == 0x3e) {
          pcVar11 = (reader->value)._M_dataplus._M_p;
          cVar9 = *pcVar11;
          if ((byte)(cVar9 - 0x3aU) < 0xf6) {
            uVar8 = 0;
          }
          else {
            uVar8 = 0;
            do {
              pcVar11 = pcVar11 + 1;
              uVar8 = (uint)(byte)(cVar9 - 0x30) + uVar8 * 10;
              cVar9 = *pcVar11;
            } while (0xf5 < (byte)(cVar9 - 0x3aU));
            uVar8 = uVar8 & 0xf;
          }
          in_RCX = (ulong)(uVar8 << 4);
          local_58 = *(aiColor4D *)((long)&g_aclrDxfIndexColors[0].r + in_RCX);
        }
        else if (iVar5 == 0x46) {
          pbVar6 = (byte *)(reader->value)._M_dataplus._M_p;
          in_RCX = (ulong)*pbVar6;
          cVar10 = '\0';
          if (0xf5 < (byte)(*pbVar6 - 0x3a)) {
            cVar10 = '\0';
            do {
              pbVar6 = pbVar6 + 1;
              cVar10 = (char)in_RCX + -0x30 + cVar10 * '\n';
              in_RCX = (ulong)*pbVar6;
            } while (0xf5 < (byte)(*pbVar6 - 0x3a));
          }
        }
      }
      DXF::LineReader::operator++(reader);
    } while (reader->end < 2);
    bVar13 = -1 < cVar10;
  }
  if (((line->flags & 0x40) != 0) && (bVar13)) {
    pLVar7 = DefaultLogger::get();
    Logger::warn(pLVar7,
                 "DXF: expected vertex to be part of a polyface but the 0x128 flag isn\'t set");
  }
  if (local_68 == 0) {
    __position_00._M_current =
         (line->positions).
         super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position_00._M_current ==
        (line->positions).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>const&>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)line,__position_00,
                 &local_64);
    }
    else {
      (__position_00._M_current)->z = local_64.z;
      (__position_00._M_current)->x = local_64.x;
      (__position_00._M_current)->y = local_64.y;
      ppaVar2 = &(line->positions).
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppaVar2 = *ppaVar2 + 1;
    }
    __position_01._M_current =
         (line->colors).super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (__position_01._M_current ==
        (line->colors).super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiColor4t<float>,std::allocator<aiColor4t<float>>>::
      _M_realloc_insert<aiColor4t<float>const&>
                ((vector<aiColor4t<float>,std::allocator<aiColor4t<float>>> *)&line->colors,
                 __position_01,&local_58);
    }
    else {
      (__position_01._M_current)->r = local_58.r;
      (__position_01._M_current)->g = local_58.g;
      (__position_01._M_current)->b = local_58.b;
      (__position_01._M_current)->a = local_58.a;
      ppaVar3 = &(line->colors).
                 super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppaVar3 = *ppaVar3 + 1;
    }
  }
  else {
    __position._M_current =
         (line->counts).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (line->counts).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)&line->counts,__position,
                 &local_68);
    }
    else {
      *__position._M_current = local_68;
      ppuVar1 = &(line->counts).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      *ppuVar1 = *ppuVar1 + 1;
    }
    if (local_68 != 0) {
      uVar12 = 0;
      do {
        if (aiStack_48[uVar12] == 0) {
          pLVar7 = DefaultLogger::get();
          Logger::warn(pLVar7,"DXF: invalid vertex index, indices are one-based.");
          puVar4 = (line->counts).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_finish + -1;
          *puVar4 = *puVar4 - 1;
          puVar4 = (line->counts).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          if (puVar4[-1] == 0) {
            (line->counts).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish = puVar4 + -1;
          }
        }
        else {
          local_6c = (float)(aiStack_48[uVar12] + -1);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                    (&line->indices,(uint *)&local_6c);
        }
        uVar12 = uVar12 + 1;
      } while (uVar12 < local_68);
    }
  }
  return;
}

Assistant:

void DXFImporter::ParsePolyLineVertex(DXF::LineReader& reader, DXF::PolyLine& line) {
    unsigned int cnti = 0, flags = 0;
    unsigned int indices[4];

    aiVector3D out;
    aiColor4D clr = AI_DXF_DEFAULT_COLOR;

    while( !reader.End() ) {

        if (reader.Is(0)) { // SEQEND or another VERTEX
            break;
        }

        switch (reader.GroupCode()) {
        case 8:
                // layer to which the vertex belongs to - assume that
                // this is always the layer the top-level poly-line
                // entity resides on as well.
                if(reader.Value() != line.layer) {
                    ASSIMP_LOG_WARN("DXF: expected vertex to be part of a poly-face but the 0x128 flag isn't set");
                }
                break;

        case 70:
                flags = reader.ValueAsUnsignedInt();
                break;

        // VERTEX COORDINATES
        case GroupCode_XComp:
            out.x = reader.ValueAsFloat();
            break;

        case GroupCode_YComp:
            out.y = reader.ValueAsFloat();
            break;

        case GroupCode_ZComp:
            out.z = reader.ValueAsFloat();
            break;

        // POLYFACE vertex indices
        case 71:
        case 72:
        case 73:
        case 74:
            if (cnti == 4) {
                ASSIMP_LOG_WARN("DXF: more than 4 indices per face not supported; ignoring");
                break;
            }
            indices[cnti++] = reader.ValueAsUnsignedInt();
            break;

        // color
        case 62:
            clr = g_aclrDxfIndexColors[reader.ValueAsUnsignedInt() % AI_DXF_NUM_INDEX_COLORS];
            break;
        };

        reader++;
    }

    if (line.flags & DXF_POLYLINE_FLAG_POLYFACEMESH && !(flags & DXF_VERTEX_FLAG_PART_OF_POLYFACE)) {
        ASSIMP_LOG_WARN("DXF: expected vertex to be part of a polyface but the 0x128 flag isn't set");
    }

    if (cnti) {
        line.counts.push_back(cnti);
        for (unsigned int i = 0; i < cnti; ++i) {
            // IMPORTANT NOTE: POLYMESH indices are ONE-BASED
            if (indices[i] == 0) {
                ASSIMP_LOG_WARN("DXF: invalid vertex index, indices are one-based.");
                --line.counts.back();
                // Workaround to fix issue 2229
                if (line.counts.back() == 0) {
                    line.counts.pop_back();
                }
                continue;
            }
            line.indices.push_back(indices[i]-1);
        }
    } else {
        line.positions.push_back(out);
        line.colors.push_back(clr);
    }
}